

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cpp
# Opt level: O0

Model * readinstance(string *filename)

{
  size_t in_RCX;
  void *__buf;
  string *in_RSI;
  Reader *in_RDI;
  Reader reader;
  Reader *this;
  string local_4e8 [32];
  undefined1 local_4c8 [48];
  string *in_stack_fffffffffffffb68;
  Reader *in_stack_fffffffffffffb70;
  
  this = (Reader *)local_4e8;
  std::__cxx11::string::string((string *)this,in_RSI);
  Reader::Reader(in_stack_fffffffffffffb70,in_stack_fffffffffffffb68);
  std::__cxx11::string::~string(local_4e8);
  Reader::read(in_RDI,(int)local_4c8,__buf,in_RCX);
  Reader::~Reader(this);
  return (Model *)in_RDI;
}

Assistant:

Model readinstance(std::string filename) {
  Reader reader(filename);
  return reader.read();
}